

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QList<bool_(*)(void_**)>_>::resize(QList<QList<bool_(*)(void_**)>_> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<QList<bool_(*)(void_**)>_> *in_RSI;
  QArrayDataPointer<QList<bool_(*)(void_**)>_> *in_RDI;
  QList<QList<bool_(*)(void_**)>_> *unaff_retaddr;
  QArrayDataPointer<QList<bool_(*)(void_**)>_> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<QList<bool_(*)(void_**)>_>::size((QList<QList<bool_(*)(void_**)>_> *)in_RDI);
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<QList<bool_(*)(void_**)>_>::operator->(in_RDI);
    QArrayDataPointer<QList<bool_(*)(void_**)>_>::appendInitialize(this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }